

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O0

void __thiscall
memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>::set
          (HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>
           *this,view_type *rng,value_type_conflict1 val)

{
  pointer __first;
  pointer __last;
  value_type_conflict1 local_1c;
  view_type *pvStack_18;
  value_type_conflict1 val_local;
  view_type *rng_local;
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_> *this_local;
  
  local_1c = val;
  pvStack_18 = rng;
  rng_local = (view_type *)this;
  __first = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
            ::begin(rng);
  __last = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
           ::end(pvStack_18);
  std::fill<float*,float>(__first,__last,&local_1c);
  return;
}

Assistant:

void set(view_type &rng, value_type val) {
        #ifdef VERBOSE
        std::cerr << util::type_printer<HostCoordinator>::print()
                  << "::" + util::blue("fill")
                  << "(" << rng.size()  << " * " << val << ")"
                  << " @ " << rng.data()
                  << std::endl;
        #endif
        std::fill(rng.begin(), rng.end(), val);
    }